

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

int __thiscall QSpanData::init(QSpanData *this,EVP_PKEY_CTX *ctx)

{
  QClipData *pQVar1;
  long in_RDX;
  
  this->rasterBuffer = (QRasterBuffer *)ctx;
  *(undefined2 *)&this->field_0x88 = 0;
  this->bilinear = false;
  this->m33 = 1.0;
  this->m11 = 1.0;
  this->m22 = 1.0;
  this->m23 = 0.0;
  this->m21 = 0.0;
  this->m12 = 0.0;
  this->m13 = 0.0;
  this->dx = 0.0;
  this->dy = 0.0;
  if (in_RDX == 0) {
    pQVar1 = (QClipData *)0x0;
  }
  else {
    pQVar1 = QRasterPaintEnginePrivate::clip(*(QRasterPaintEnginePrivate **)(in_RDX + 0x18));
  }
  this->clip = pQVar1;
  return (int)pQVar1;
}

Assistant:

void QSpanData::init(QRasterBuffer *rb, const QRasterPaintEngine *pe)
{
    rasterBuffer = rb;
    type = None;
    txop = 0;
    bilinear = false;
    m11 = m22 = m33 = 1.;
    m12 = m13 = m21 = m23 = dx = dy = 0.0;
    clip = pe ? pe->d_func()->clip() : nullptr;
}